

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfKeyCode.cpp
# Opt level: O0

void __thiscall Imf_3_3::KeyCode::setPerfsPerFrame(KeyCode *this,int perfsPerFrame)

{
  ArgExc *this_00;
  int in_ESI;
  long in_RDI;
  char *in_stack_ffffffffffffffc8;
  
  if ((0 < in_ESI) && (in_ESI < 0x10)) {
    *(int *)(in_RDI + 0x14) = in_ESI;
    return;
  }
  this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_3_3::ArgExc::ArgExc(this_00,in_stack_ffffffffffffffc8);
  __cxa_throw(this_00,&Iex_3_3::ArgExc::typeinfo,Iex_3_3::ArgExc::~ArgExc);
}

Assistant:

void
KeyCode::setPerfsPerFrame (int perfsPerFrame)
{
    if (perfsPerFrame < 1 || perfsPerFrame > 15)
        throw IEX_NAMESPACE::ArgExc (
            "Invalid key code number of perforations per frame "
            "(must be between 1 and 15).");

    _perfsPerFrame = perfsPerFrame;
}